

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

BoardSize __thiscall Panel::checkBoardSize(Panel *this)

{
  char cVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    cVar1 = QAbstractButton::isChecked();
    if (cVar1 != '\0') break;
  }
  return p_Var2[1]._M_color;
}

Assistant:

BoardSize Panel::checkBoardSize()
{
    const auto it = std::find_if( radioSizeMap.begin(), radioSizeMap.end(), [] ( const auto& it ) { return it.second.isChecked(); });
    return it->first;
}